

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

ExprPtr __thiscall pegmatite::nl(pegmatite *this,ExprPtr *e)

{
  NewlineExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  ExprPtr local_28;
  ExprPtr *local_18;
  ExprPtr *e_local;
  
  local_18 = e;
  e_local = (ExprPtr *)this;
  this_00 = (NewlineExpr *)operator_new(0x18);
  ExprPtr::ExprPtr(&local_28,local_18);
  anon_unknown.dwarf_50a29::NewlineExpr::NewlineExpr(this_00,&local_28);
  ExprPtr::ExprPtr((ExprPtr *)this,(Expr *)this_00);
  ExprPtr::~ExprPtr(&local_28);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr nl(const ExprPtr &e)
{
	return ExprPtr(new NewlineExpr(e));
}